

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O3

void af_glyph_hints_align_weak_points(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Point_conflict p1;
  int iVar1;
  int iVar2;
  AF_Point_conflict p2;
  long lVar3;
  AF_Point_conflict pAVar4;
  AF_Point_conflict pAVar5;
  ushort uVar6;
  AF_Point_conflict *ppAVar7;
  AF_Point_conflict pAVar8;
  AF_Point_conflict *ppAVar9;
  AF_Point_conflict ref1;
  AF_Point_conflict ref2;
  AF_Point_conflict ref2_00;
  
  pAVar5 = hints->points;
  ppAVar9 = hints->contours;
  iVar1 = hints->num_points;
  pAVar8 = pAVar5 + iVar1;
  iVar2 = hints->num_contours;
  if (dim == AF_DIMENSION_HORZ) {
    uVar6 = 4;
    pAVar4 = pAVar5;
    if (0 < iVar1) {
      do {
        pAVar4->u = pAVar4->x;
        pAVar4->v = pAVar4->ox;
        pAVar4 = pAVar4 + 1;
      } while (pAVar4 < pAVar8);
    }
  }
  else {
    uVar6 = 8;
    pAVar4 = pAVar5;
    if (0 < iVar1) {
      do {
        pAVar4->u = pAVar4->y;
        pAVar4->v = pAVar4->oy;
        pAVar4 = pAVar4 + 1;
      } while (pAVar4 < pAVar8);
    }
  }
  if (iVar2 < 1) {
LAB_0023d0ba:
    if (dim == AF_DIMENSION_HORZ) {
      if (0 < iVar1) {
        do {
          pAVar5->x = pAVar5->u;
          pAVar5 = pAVar5 + 1;
        } while (pAVar5 < pAVar8);
      }
    }
    else if (0 < iVar1) {
      do {
        pAVar5->y = pAVar5->u;
        pAVar5 = pAVar5 + 1;
      } while (pAVar5 < pAVar8);
    }
    return;
  }
  ppAVar7 = ppAVar9 + iVar2;
LAB_0023cfbd:
  pAVar4 = *ppAVar9;
  p2 = pAVar4->prev;
  for (ref2_00 = pAVar4; ref2_00 <= p2; ref2_00 = ref2_00 + 1) {
    ref2 = ref2_00;
    if ((uVar6 & ref2_00->flags) != 0) goto LAB_0023cfef;
  }
  goto LAB_0023d0ad;
LAB_0023cfef:
  ref1 = ref2;
  if (ref1 < p2) goto code_r0x0023cff7;
  goto LAB_0023d003;
code_r0x0023cff7:
  ref2 = ref1 + 1;
  if ((uVar6 & ref1[1].flags) != 0) goto LAB_0023cfef;
LAB_0023d003:
  p1 = ref1 + 1;
  ref2 = p1;
  if (p1 <= p2) {
    while ((uVar6 & ref2->flags) == 0) {
      ref2 = ref2 + 1;
      if (p2 < ref2) goto LAB_0023d031;
    }
    af_iup_interp(p1,ref2 + -1,ref1,ref2);
    goto LAB_0023cfef;
  }
LAB_0023d031:
  if (ref2_00 == ref1) {
    lVar3 = ref2_00->u - ref2_00->v;
    if (lVar3 != 0) {
      for (; pAVar4 < ref2_00; pAVar4 = pAVar4 + 1) {
        pAVar4->u = pAVar4->v + lVar3;
      }
      while (ref2_00 + 1 <= p2) {
        ref2_00[1].u = ref2_00[1].v + lVar3;
        ref2_00 = ref2_00 + 1;
      }
    }
  }
  else {
    if (ref1 < p2) {
      af_iup_interp(p1,p2,ref1,ref2_00);
    }
    if (pAVar5 < ref2_00) {
      af_iup_interp(pAVar4,ref2_00 + -1,ref1,ref2_00);
    }
  }
LAB_0023d0ad:
  ppAVar9 = ppAVar9 + 1;
  if (ppAVar7 <= ppAVar9) goto LAB_0023d0ba;
  goto LAB_0023cfbd;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_weak_points( AF_GlyphHints  hints,
                                    AF_Dimension   dim )
  {
    AF_Point   points        = hints->points;
    AF_Point   point_limit   = points + hints->num_points;
    AF_Point*  contour       = hints->contours;
    AF_Point*  contour_limit = contour + hints->num_contours;
    FT_UInt    touch_flag;
    AF_Point   point;
    AF_Point   end_point;
    AF_Point   first_point;


    /* PASS 1: Move segment points to edge positions */

    if ( dim == AF_DIMENSION_HORZ )
    {
      touch_flag = AF_FLAG_TOUCH_X;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->x;
        point->v = point->ox;
      }
    }
    else
    {
      touch_flag = AF_FLAG_TOUCH_Y;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->y;
        point->v = point->oy;
      }
    }

    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  first_touched, last_touched;


      point       = *contour;
      end_point   = point->prev;
      first_point = point;

      /* find first touched point */
      for (;;)
      {
        if ( point > end_point )  /* no touched point in contour */
          goto NextContour;

        if ( point->flags & touch_flag )
          break;

        point++;
      }

      first_touched = point;

      for (;;)
      {
        FT_ASSERT( point <= end_point                 &&
                   ( point->flags & touch_flag ) != 0 );

        /* skip any touched neighbours */
        while ( point < end_point                    &&
                ( point[1].flags & touch_flag ) != 0 )
          point++;

        last_touched = point;

        /* find the next touched point, if any */
        point++;
        for (;;)
        {
          if ( point > end_point )
            goto EndContour;

          if ( ( point->flags & touch_flag ) != 0 )
            break;

          point++;
        }

        /* interpolate between last_touched and point */
        af_iup_interp( last_touched + 1, point - 1,
                       last_touched, point );
      }

    EndContour:
      /* special case: only one point was touched */
      if ( last_touched == first_touched )
        af_iup_shift( first_point, end_point, first_touched );

      else /* interpolate the last part */
      {
        if ( last_touched < end_point )
          af_iup_interp( last_touched + 1, end_point,
                         last_touched, first_touched );

        if ( first_touched > points )
          af_iup_interp( first_point, first_touched - 1,
                         last_touched, first_touched );
      }

    NextContour:
      ;
    }

    /* now save the interpolated values back to x/y */
    if ( dim == AF_DIMENSION_HORZ )
    {
      for ( point = points; point < point_limit; point++ )
        point->x = point->u;
    }
    else
    {
      for ( point = points; point < point_limit; point++ )
        point->y = point->u;
    }
  }